

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.h
# Opt level: O2

bool glslang::TDefaultIoResolverBase::isTextureType(TType *type)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar2;
  
  iVar1 = (*type->_vptr_TType[7])();
  if (iVar1 == 0xe) {
    iVar1 = (*type->_vptr_TType[8])(type);
    if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 2) & 0x28) == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = (*type->_vptr_TType[8])(type);
      bVar2 = *(char *)(CONCAT44(extraout_var_00,iVar1) + 1) == '\a';
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool isTextureType(const glslang::TType& type) {
        return (type.getBasicType() == glslang::EbtSampler &&
                (type.getSampler().isTexture() || type.getSampler().isSubpass()));
    }